

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O3

wchar_t textui_do_birth(void)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  ui_event_type uVar4;
  keycode_t kVar5;
  uint32_t uVar6;
  textblock *tb;
  size_t sVar7;
  char *__dest;
  char *__src;
  char *pcVar8;
  level_map_conflict *plVar9;
  void *pvVar10;
  menu_conflict *pmVar11;
  command_conflict *pcVar12;
  uint uVar13;
  long lVar14;
  cmd_code cVar15;
  mouseclick mVar16;
  wchar_t i;
  ulong uVar17;
  wchar_t wVar18;
  long lVar19;
  int iVar20;
  birth_stage current;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  region orig_area;
  ui_event uVar26;
  keypress kVar27;
  size_t *line_lengths;
  size_t *line_starts;
  char old_history [240];
  uint local_254;
  size_t local_250;
  size_t *local_248;
  size_t *local_240;
  char local_235 [5];
  ulong local_230;
  undefined8 local_228;
  uint8_t local_220;
  size_t local_218 [30];
  region_conflict local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  
  cmdq_push(CMD_BIRTH_INIT);
  cmdq_execute(CTX_BIRTH);
  local_230 = 0xffffffff;
  uVar22 = 0;
  local_254 = 0;
  do {
    current = (birth_stage)uVar22;
    iVar20 = (int)local_230;
    local_230 = uVar22;
    switch(uVar22) {
    case 0:
      cmdq_push(CMD_BIRTH_RESET);
      uVar22 = (ulong)(2 - quickstart_allowed);
      local_254 = 0;
      break;
    case 1:
      bVar1 = false;
      display_player(L'\0');
      prt("New character based on previous one:",L'\0',L'\0');
      prt("[\'Y\': use as is; \'N\': redo; \'C\': change name/history; \'=\': set birth options]",
          Term->hgt + L'\xffffffff',Term->wid / 2 + L'\xffffffda');
      kVar27 = inkey();
      uVar25 = kVar27._0_8_;
      uVar17 = uVar25 & 0xffffffdf00000000;
      uVar22 = 2;
      cVar15 = CMD_BIRTH_RESET;
      if (uVar17 != 0x4e00000000) {
        do {
          if (uVar25 >> 0x20 == 0x18) {
            quit((char *)0x0);
          }
          else {
            if ((uVar17 == 0x4300000000) && (arg_force_name == false)) {
              clear_from(L'\x17');
              goto LAB_001d436e;
            }
            if ((int)(uVar25 >> 0x20) == 0x3d) {
              do_cmd_options_birth();
            }
            else if (uVar17 == 0x5900000000) {
              uVar22 = 0xb;
              bVar1 = true;
              cVar15 = CMD_ACCEPT_CHARACTER;
              goto LAB_001d3d2a;
            }
          }
          kVar27 = inkey();
          uVar25 = kVar27._0_8_;
          uVar17 = uVar25 & 0xffffffdf00000000;
        } while (uVar17 != 0x4e00000000);
        bVar1 = false;
      }
LAB_001d3d2a:
      cmdq_push(cVar15);
      clear_from(L'\x17');
      if (bVar1) goto LAB_001d46f3;
      break;
    case 2:
      Term_clear();
      text_out_hook = text_out_to_screen;
      text_out_indent = L'\x05';
      Term_gotoxy(L'\x05',L'\x01');
      text_out_e(
                "    *    \n  #{light yellow}#{/} {light yellow}#{/}#  \n #{light green}#{/}{light yellow}#{/} {light yellow}#{/}{light green}#{/}# \n/{light yellow}##{/}{deep light blue}/{/}{yellow}@{/}{deep light blue}\\{/}{light yellow}##{/}\\\n*  {yellow}@{/}{orange}@{/}{yellow}@{/}  *  Welcome to First Age Angband!\n\\{light yellow}##{/}{deep light blue}\\{/}{yellow}@{/}{deep light blue}/{/}{light yellow}##{/}/\n #{light green}#{/}{light yellow}#{/} {light yellow}#{/}{light green}#{/}# \n  #{light yellow}#{/} {light yellow}#{/}#  \n    *    \n\nThere are different ways of structuring the world\nof FAangband; \'{light green}?{/}\' gives more details."
                );
      text_out_indent = L'\0';
      pmVar11 = menu_new(MN_SKIN_SCROLL,&map_menu_iter);
      local_128.col = 5;
      local_128.row = 0xe;
      local_128.width = 0x46;
      local_128.page_rows = -99;
      current_map_index = L'\xffffffff';
      num_maps = L'\x01';
      if (maps != (level_map_conflict *)0x0) {
        num_maps = L'\x01';
        plVar9 = maps;
        do {
          if (plVar9 == world) {
            current_map_index = num_maps + L'\xffffffff';
          }
          plVar9 = plVar9->next;
          num_maps = num_maps + L'\x01';
        } while (plVar9 != (level_map_conflict *)0x0);
      }
      pvVar10 = mem_zalloc((long)num_maps << 4);
      wVar18 = num_maps;
      lVar19 = (long)num_maps;
      if (0 < lVar19) {
        lVar14 = 0;
        plVar9 = maps;
        do {
          if (plVar9 == (level_map_conflict *)0x0) {
            *(char **)((long)pvVar10 + lVar14) = "Quit";
            *(char **)((long)pvVar10 + lVar14 + 8) = "Quit FAangband.";
            plVar9 = (level_map_conflict *)0x0;
          }
          else {
            pcVar8 = plVar9->help;
            *(undefined8 *)((long)pvVar10 + lVar14) = plVar9->name;
            ((undefined8 *)((long)pvVar10 + lVar14))[1] = pcVar8;
            plVar9 = plVar9->next;
          }
          lVar14 = lVar14 + 0x10;
        } while (lVar19 << 4 != lVar14);
      }
      menu_setpriv(pmVar11,wVar18,pvVar10);
      pmVar11->cmd_keys = "?";
      pmVar11->flags = 8;
      pmVar11->selections = "abcdefghijklmnopqrstuvwxyz";
      pmVar11->browse_hook = map_menu_browser;
      local_128.page_rows = num_maps + L'\x01';
      menu_layout(pmVar11,&local_128);
      screen_save();
      region_erase_bordered((region *)&pmVar11->active);
      uVar22 = 0;
      menu_select(pmVar11,0,true);
      screen_load();
      if (current_map_index != L'\xffffffff') {
        if (current_map_index == num_maps + L'\xffffffff') {
          uVar22 = 0;
          quit((char *)0x0);
        }
        else {
          cmdq_push(CMD_CHOOSE_MAP);
          pcVar12 = cmdq_peek();
          cmd_set_arg_choice(pcVar12,"choice",pmVar11->cursor);
          uVar22 = 3;
        }
      }
      pvVar10 = menu_priv(pmVar11);
      mem_free(pvVar10);
      mem_free(pmVar11);
      break;
    case 3:
    case 4:
    case 5:
      Term_clear();
      Term_clear();
      text_out_hook = text_out_to_screen;
      text_out_indent = L'\x02';
      Term_gotoxy(L'\x02',L'\x01');
      text_out_e(
                "{light blue}Please select your character traits from the menus below:{/}\n\nUse the {light green}movement keys{/} to scroll the menu, {light green}Enter{/} to select the current menu item, \'{light green}*{/}\' for a random menu item, \'{light green}@{/}\' to finish the character with random selections, \'{light green}ESC{/}\' to step back through the birth process, \'{light green}={/}\' for the birth options, \'{light green}?{/}\' for help, or \'{light green}Ctrl-X{/}\' to quit."
                );
      text_out_indent = L'\0';
      cVar15 = CMD_CHOOSE_RACE;
      pmVar11 = &race_menu;
      if (3 < (uint)current) {
        menu_refresh(&race_menu,false);
        cVar15 = CMD_CHOOSE_CLASS;
        if (current == BIRTH_CLASS_CHOICE) {
          pmVar11 = &class_menu;
        }
        else {
          menu_refresh(&class_menu,false);
          pmVar11 = &roller_menu;
        }
      }
      pvVar10 = menu_priv(pmVar11);
      wVar18 = L'\a';
      do {
        Term_erase(L'\0',wVar18,L'ÿ');
        wVar18 = wVar18 + L'\x01';
      } while (wVar18 != L'\t');
      Term_putstr(L'\x02',L'\a',L'\xffffffff',L'\v',*(char **)((long)pvVar10 + 8));
      pmVar11->cmd_keys = "?=*@\x18";
      do {
        *(birth_stage *)((long)pvVar10 + 0x14) = current;
        uVar25 = 0;
        uVar26 = menu_select(pmVar11,1,false);
        uVar4 = uVar26.type;
        if ((int)uVar4 < 0x40) {
          if (uVar4 == EVT_KBRD) {
            kVar5 = uVar26.key.code;
            if ((int)kVar5 < 0x3d) {
              if (kVar5 == 0x18) {
                uVar25 = 0;
                quit((char *)0x0);
              }
              else if ((kVar5 == 0x2a) && (*(char *)((long)pvVar10 + 0x10) == '\x01')) {
                uVar6 = Rand_div(pmVar11->count);
                pmVar11->cursor = uVar6;
                cmdq_push(cVar15);
                pcVar12 = cmdq_peek();
                cmd_set_arg_choice(pcVar12,"choice",pmVar11->cursor);
                menu_refresh(pmVar11,false);
                goto LAB_001d3f7d;
              }
            }
            else if (kVar5 == 0x3d) {
              do_cmd_options_birth();
              uVar25 = uVar22;
            }
            else if (kVar5 == 0x3f) {
              do_cmd_help();
            }
            else if (kVar5 == 0x40) {
              finish_with_random_choices(current);
              uVar22 = 10;
              goto switchD_001d3409_default;
            }
          }
          else if (uVar4 == EVT_ESCAPE) {
            uVar24 = current + BIRTH_BACK;
            goto LAB_001d4074;
          }
        }
        else if (uVar4 == EVT_SELECT) {
          if (current == BIRTH_ROLLER_CHOICE) {
            if (pmVar11->cursor == 0) {
              point_based_start();
              cmdq_push(CMD_RESET_STATS);
              pcVar12 = cmdq_peek();
              cmd_set_arg_choice(pcVar12,"choice",L'\x01');
LAB_001d43ab:
              uVar22 = 6;
            }
            else {
              cmdq_push(CMD_ROLL_STATS);
              uVar22 = 7;
            }
            goto switchD_001d3409_default;
          }
          cmdq_push(cVar15);
          pcVar12 = cmdq_peek();
          cmd_set_arg_choice(pcVar12,"choice",pmVar11->cursor);
LAB_001d3f7d:
          uVar25 = (ulong)(uint)(current + BIRTH_QUICKSTART);
        }
        else {
          uVar25 = 0;
          if (uVar4 == EVT_SWITCH) {
            uVar25 = (ulong)*(uint *)((long)pvVar10 + 0x14);
          }
        }
        uVar23 = (uint)uVar25;
      } while (uVar23 == 0);
      uVar24 = current + BIRTH_BACK;
      if (uVar23 != 0xffffffff) {
        uVar24 = uVar23;
      }
LAB_001d4074:
      uVar22 = (ulong)uVar24;
      if (uVar24 == 1) {
        uVar22 = 0;
      }
      break;
    case 6:
      if (6 < iVar20) {
        point_based_start();
        cmdq_push(CMD_REFRESH_STATS);
        cmdq_execute(CTX_BIRTH);
      }
      Term_gotoxy(L'N',point_based_command_stat + L'\x02');
      do {
        uVar26 = inkey_ex();
        uVar25 = uVar26._0_8_;
        uVar4 = uVar26.type;
        if (uVar4 - EVT_KBRD < 2) {
          uVar24 = uVar26.key.code;
          if (uVar4 == EVT_KBRD) {
            if (uVar25 >> 0x20 == 0x18) {
switchD_001d4569_caseD_6:
              quit((char *)0x0);
            }
            else {
              if (uVar24 == 0xe000) break;
              if ((uVar25 & 0xffffffdf00000000) == 0x5200000000) goto switchD_001d4569_caseD_4;
              if (uVar24 == 0x2b) goto switchD_001d4602_caseD_6;
              if (uVar24 == 0x2d) goto switchD_001d4602_caseD_4;
              uVar22 = 8;
              if (uVar24 == 0x9c) goto LAB_001d414d;
              kVar27._8_4_ = uVar26._8_4_ & 0xff;
              kVar27.type = (int)uVar25;
              kVar27.code = (int)(uVar25 >> 0x20);
              wVar18 = target_dir(kVar27);
              switch(wVar18) {
              case L'\x02':
                point_based_command_stat =
                     point_based_command_stat +
                     ((uint)(point_based_command_stat + L'\x01') / 5) * -5 + L'\x01';
                break;
              case L'\x04':
                goto switchD_001d4602_caseD_4;
              case L'\x06':
                goto switchD_001d4602_caseD_6;
              case L'\b':
                point_based_command_stat =
                     point_based_command_stat +
                     ((uint)(point_based_command_stat + L'\x04') / 5) * -5 + L'\x04';
              }
            }
          }
          else {
            if ((uVar25 & 0xff000000000000) == 0x2000000000000) break;
            uVar23 = uVar24 >> 8 & 0xff;
            if (((uint)(uVar23 + L'\xfffffffe') < 5) &&
               (uVar23 != point_based_command_stat + L'\x02')) {
              local_254 = 6;
              point_based_command_stat = uVar23 + L'\xfffffffe';
              goto LAB_001d43ab;
            }
            pcVar8 = string_make("abcdefghijklmnopqrstuvwxyz");
            pmVar11 = menu_dynamic_new();
            pmVar11->selections = pcVar8;
            uVar22 = (ulong)(uint)point_based_command_stat;
            uVar13 = point_based_command_stat + L'\x02';
            if (uVar23 == uVar13) {
              if ((*(byte *)(buysell + uVar22) & 1) != 0) {
                menu_dynamic_add_label(pmVar11,"Sell",'s',2,pcVar8);
                uVar22 = (ulong)(uint)point_based_command_stat;
                uVar13 = point_based_command_stat + L'\x02';
                goto LAB_001d446c;
              }
LAB_001d4471:
              if ((*(byte *)(buysell + uVar22) & 2) != 0) {
                menu_dynamic_add_label(pmVar11,"Buy",'b',1,pcVar8);
              }
            }
            else {
LAB_001d446c:
              if (uVar23 == uVar13) goto LAB_001d4471;
            }
            menu_dynamic_add_label(pmVar11,"Accept",'a',5,pcVar8);
            menu_dynamic_add_label(pmVar11,"Reset",'r',4,pcVar8);
            local_254 = 6;
            menu_dynamic_add_label(pmVar11,"Quit",'q',6,pcVar8);
            screen_save();
            menu_dynamic_calc_location(pmVar11,uVar24 & 0xff,uVar23);
            region_erase_bordered((region *)&pmVar11->boundary);
            iVar20 = menu_dynamic_select(pmVar11);
            menu_dynamic_free(pmVar11);
            string_free(pcVar8);
            screen_load();
            uVar22 = 6;
            switch(iVar20) {
            case 1:
switchD_001d4602_caseD_6:
              cVar15 = CMD_BUY_STAT;
              break;
            case 2:
switchD_001d4602_caseD_4:
              cVar15 = CMD_SELL_STAT;
              break;
            case 3:
              goto switchD_001d4569_caseD_3;
            case 4:
switchD_001d4569_caseD_4:
              cmdq_push(CMD_RESET_STATS);
              pcVar12 = cmdq_peek();
              wVar18 = L'\0';
              goto LAB_001d466f;
            case 5:
              uVar22 = 8;
              goto LAB_001d414d;
            case 6:
              goto switchD_001d4569_caseD_6;
            default:
              goto switchD_001d3409_default;
            }
            cmdq_push(cVar15);
            pcVar12 = cmdq_peek();
            wVar18 = point_based_command_stat;
LAB_001d466f:
            cmd_set_arg_choice(pcVar12,"choice",wVar18);
          }
          local_254 = 6;
          uVar22 = 6;
          goto switchD_001d3409_default;
        }
      } while (uVar4 != EVT_ESCAPE);
switchD_001d4569_caseD_3:
      uVar22 = 5;
LAB_001d414d:
      event_remove_handler(EVENT_BIRTHPOINTS,point_based_points,(void *)0x0);
      event_remove_handler(EVENT_STATS,point_based_stats,(void *)0x0);
      event_remove_handler(EVENT_GOLD,point_based_misc,(void *)0x0);
      local_254 = 6;
      break;
    case 7:
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_128.col = 0;
      local_128.row = 0;
      local_128.width = 0;
      local_128.page_rows = 0;
      local_218[0] = 0;
      display_player(L'\0');
      if (iVar20 < 7) {
        roller_command_prev_roll = 0;
      }
      strnfcat((char *)&local_128,0x50,local_218,"[\'r\' to reroll");
      if (roller_command_prev_roll == 1) {
        strnfcat((char *)&local_128,0x50,local_218,", \'p\' for previous roll");
      }
      strnfcat((char *)&local_128,0x50,local_218," or \'Enter\' to accept]");
      prt((char *)&local_128,Term->hgt + L'\xffffffff',Term->wid / 2 - (int)(local_218[0] >> 1));
      do {
        uVar26 = inkey_ex();
        mVar16 = uVar26.mouse;
        uVar4 = uVar26.type;
        if (uVar4 - EVT_KBRD < 2) goto LAB_001d39e2;
        if (uVar4 == EVT_ESCAPE) goto switchD_001d42f6_caseD_1;
      } while (uVar4 != EVT_BUTTON);
      mVar16 = (mouseclick)(((ulong)mVar16 & 0xffffffff00000000) + 1);
LAB_001d39e2:
      uVar22 = 7;
      uVar24 = mVar16._4_4_;
      if (mVar16.type != EVT_MOUSE) {
        if (mVar16.type == EVT_KBRD) {
          if ((int)uVar24 < 0x9c) {
            if ((uVar24 == 0x20) || (uVar24 == 0x72)) goto switchD_001d42f6_caseD_2;
          }
          else {
            if (uVar24 == 0x9c) goto switchD_001d42f6_caseD_4;
            if (uVar24 == 0xe000) goto switchD_001d42f6_caseD_1;
          }
          if ((uVar24 == 0x70) && ((roller_command_prev_roll & 1) != 0))
          goto switchD_001d42f6_caseD_3;
          if (uVar24 == 0x18) goto switchD_001d42f6_caseD_5;
          if (uVar24 == 0x3f) goto switchD_001d42f6_caseD_6;
          bell();
        }
        goto switchD_001d42f6_default;
      }
      if (((ulong)mVar16 & 0xff000000000000) == 0x2000000000000) {
switchD_001d42f6_caseD_1:
        uVar22 = 5;
      }
      else {
        pcVar8 = string_make("abcdefghijklmnopqrstuvwxyz");
        pmVar11 = menu_dynamic_new();
        pmVar11->selections = pcVar8;
        menu_dynamic_add_label(pmVar11,"Reroll",'r',2,pcVar8);
        if (roller_command_prev_roll == 1) {
          menu_dynamic_add_label(pmVar11,"Retrieve previous",'p',3,pcVar8);
        }
        menu_dynamic_add_label(pmVar11,"Accept",'a',4,pcVar8);
        menu_dynamic_add_label(pmVar11,"Quit",'q',5,pcVar8);
        menu_dynamic_add_label(pmVar11,"Help",'?',6,pcVar8);
        screen_save();
        menu_dynamic_calc_location(pmVar11,uVar24 & 0xff,uVar24 >> 8 & 0xff);
        region_erase_bordered((region *)&pmVar11->boundary);
        iVar20 = menu_dynamic_select(pmVar11);
        menu_dynamic_free(pmVar11);
        string_free(pcVar8);
        screen_load();
        switch(iVar20) {
        case 1:
          goto switchD_001d42f6_caseD_1;
        case 2:
switchD_001d42f6_caseD_2:
          cmdq_push(CMD_ROLL_STATS);
          roller_command_prev_roll = 1;
          break;
        case 3:
switchD_001d42f6_caseD_3:
          cmdq_push(CMD_PREV_STATS);
          break;
        case 4:
switchD_001d42f6_caseD_4:
          uVar22 = 8;
          break;
        case 5:
switchD_001d42f6_caseD_5:
          quit((char *)0x0);
          break;
        case 6:
switchD_001d42f6_caseD_6:
          do_cmd_help();
        }
      }
switchD_001d42f6_default:
      local_254 = 7;
      break;
    case 8:
      if (iVar20 < 8) {
        display_player(L'\0');
      }
      if (arg_name[0] != '\0') {
        my_strcpy(player->full_name,arg_name,0x20);
      }
      if (arg_force_name == false) {
        _Var2 = get_character_name((char *)&local_128,0x20);
        if ((!_Var2) ||
           (((savefile[0] == '\0' &&
             (_Var2 = savefile_name_already_used((char *)&local_128,true,true), _Var2)) &&
            (_Var2 = get_check("A savefile for that name exists.  Overwrite it? "), !_Var2)))) {
          uVar22 = (ulong)local_254;
          break;
        }
        cmdq_push(CMD_NAME_CHOICE);
        pcVar12 = cmdq_peek();
        cmd_set_arg_string(pcVar12,"name",(char *)&local_128);
      }
LAB_001d419d:
      uVar22 = 9;
      break;
    case 9:
      if (iVar20 < 9) {
        display_player(L'\0');
      }
      my_strcpy((char *)&local_128,player->history,0xf0);
      prt("Accept character history? [y/n]",L'\0',L'\0');
      kVar27 = inkey();
      if (kVar27._0_8_ >> 0x20 == 0x18) {
        uVar22 = 0;
        quit((char *)0x0);
      }
      else if (kVar27.code == 0xe000) {
LAB_001d436e:
        uVar22 = 8;
      }
      else {
        uVar22 = 10;
        if ((kVar27._0_8_ & 0xffffffdf00000000) == 0x4e00000000) {
          my_strcpy((char *)local_218,player->history,0xf0);
          local_250 = strlen((char *)local_218);
          iVar20 = 0;
          do {
            tb = textblock_new();
            local_240 = (size_t *)0x0;
            local_248 = (size_t *)0x0;
            clear_from(L'\x12');
            textblock_append(tb,"%s",local_218);
            orig_area.width = L'G';
            orig_area.page_rows = L'\x05';
            orig_area.col = L'\x01';
            orig_area.row = L'\x13';
            textui_textblock_place(tb,orig_area,(char *)0x0);
            sVar7 = textblock_calculate_lines(tb,&local_240,&local_248,0x47);
            uVar22 = (ulong)iVar20;
            if (sVar7 == 0) {
              wVar18 = L'\x01';
              iVar21 = 0;
              uVar25 = 0;
            }
            else {
              wVar18 = L'\x01';
              iVar21 = (int)local_248[sVar7 - 1] + (int)local_240[sVar7 - 1];
              uVar25 = 0;
              if (local_248 != (size_t *)0x0 && local_240 != (size_t *)0x0) {
                uVar17 = 0;
                lVar19 = 0;
                do {
                  if ((local_240[uVar17] <= uVar22) &&
                     (uVar22 <= local_240[uVar17] + local_248[uVar17])) {
                    wVar18 = (iVar20 - (int)lVar19) + L'\x01';
                    uVar25 = uVar17 & 0xffffffff;
                    break;
                  }
                  lVar19 = lVar19 + local_248[uVar17] + 1;
                  uVar17 = uVar17 + 1;
                } while (sVar7 != uVar17);
              }
            }
            iVar3 = (int)uVar25;
            Term_gotoxy(wVar18,iVar3 + L'\x13');
            kVar27 = inkey();
            local_228 = kVar27._0_8_;
            local_220 = kVar27.mods;
            kVar5 = kVar27.code;
            uVar24 = (uint)local_250;
            switch(kVar5) {
            case 0x94:
              iVar20 = 0;
              goto LAB_001d3855;
            case 0x95:
            case 0x97:
            case 0x98:
            case 0x99:
            case 0x9a:
            case 0x9b:
            case 0x9d:
switchD_001d3651_caseD_95:
              _Var2 = keycode_isprint(kVar5);
              if (_Var2) {
                sVar7 = utf32_to_utf8(local_235,5,(uint32_t *)((long)&local_228 + 4),1,(size_t *)0x0
                                     );
                iVar3 = (int)sVar7;
                if ((iVar3 != 0) && (uVar23 = uVar24 + iVar3, (int)uVar23 < 0xf0)) {
                  if (iVar20 == iVar21) {
                    pcVar8 = (char *)((long)local_218 + (long)(int)uVar24);
                  }
                  else {
                    pcVar8 = utf8_fskip((char *)local_218,uVar22,(char *)0x0);
                    if (pcVar8 == (char *)0x0) {
                      __assert_fail("ocurs",
                                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-birth.c"
                                    ,0x6c4,"int edit_text(char *, int)");
                    }
                    memmove(pcVar8 + iVar3,pcVar8,
                            (size_t)((long)local_218 + ((long)(int)uVar24 - (long)pcVar8)));
                  }
                  memcpy(pcVar8,local_235,(long)iVar3);
                  iVar20 = iVar20 + 1;
                  *(undefined1 *)((long)local_218 + (long)(int)uVar23) = 0;
                  uVar24 = uVar23;
                }
              }
              local_250 = (size_t)uVar24;
              bVar1 = false;
              break;
            case 0x96:
              bVar1 = false;
              iVar20 = iVar21;
              if (iVar21 < 1) {
                iVar20 = 0;
              }
              break;
            case 0x9c:
              bVar1 = true;
              break;
            case 0x9e:
            case 0x9f:
              if ((kVar5 != 0x9f) || (bVar1 = false, iVar20 != 0)) {
                if ((kVar5 != 0x9e) || (iVar20 < iVar21)) {
                  pcVar8 = utf8_fskip((char *)local_218,uVar22,(char *)0x0);
                  if (pcVar8 == (char *)0x0) {
                    __assert_fail("ocurs",
                                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-birth.c"
                                  ,0x691,"int edit_text(char *, int)");
                  }
                  if (local_228._4_4_ == 0x9f) {
                    __dest = utf8_rskip(pcVar8,1,(char *)local_218);
                    if (__dest == (char *)0x0) {
                      __assert_fail("oshift",
                                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-birth.c"
                                    ,0x695,"int edit_text(char *, int)");
                    }
                    memmove(__dest,pcVar8,(long)local_218 + ((long)(int)uVar24 - (long)pcVar8));
                    iVar20 = iVar20 + -1;
                    __src = pcVar8;
                  }
                  else {
                    __src = utf8_fskip(pcVar8,1,(char *)0x0);
                    if (__src == (char *)0x0) {
                      __assert_fail("oshift",
                                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-birth.c"
                                    ,0x69e,"int edit_text(char *, int)");
                    }
                    memmove(pcVar8,__src,(long)local_218 + ((long)(int)uVar24 - (long)__src));
                    __dest = pcVar8;
                  }
                  uVar24 = uVar24 + ((int)__dest - (int)__src);
                  local_250 = (size_t)uVar24;
                  *(undefined1 *)((long)local_218 + (long)(int)uVar24) = 0;
                }
                goto LAB_001d3855;
              }
              iVar20 = 0;
              break;
            default:
              switch(kVar5) {
              case 0x80:
                iVar3 = (int)local_248[iVar3] + iVar20 + 1;
                if (iVar3 < iVar21) {
                  iVar20 = iVar3;
                }
                break;
              case 0x81:
                iVar20 = iVar20 - (uint)(0 < iVar20);
                break;
              case 0x82:
                iVar20 = iVar20 + (uint)(iVar20 < iVar21);
                break;
              case 0x83:
                if (iVar3 < 1) {
                  bVar1 = false;
                }
                else {
                  iVar21 = ~(uint)local_248[uVar25 - 1] + iVar20;
                  if (iVar21 < 0) {
                    iVar21 = iVar20;
                  }
                  bVar1 = false;
                  iVar20 = iVar21;
                }
                goto LAB_001d385c;
              default:
                if (kVar5 != 0xe000) goto switchD_001d3651_caseD_95;
                uVar22 = 8;
                goto switchD_001d3409_default;
              }
LAB_001d3855:
              bVar1 = false;
            }
LAB_001d385c:
            mem_free(local_240);
            mem_free(local_248);
            textblock_free(tb);
          } while (!bVar1);
          cmdq_push(CMD_HISTORY_CHOICE);
          pcVar12 = cmdq_peek();
          cmd_set_arg_string(pcVar12,"history",(char *)local_218);
          uVar22 = 9;
        }
      }
      break;
    case 10:
      if (iVar20 < 10) {
        display_player(L'\0');
      }
      prt("[\'ESC\' to step back, \'S\' to start over, or any other key to continue]",
          Term->hgt + L'\xffffffff',Term->wid / 2 + L'\xffffffde');
      kVar27 = inkey();
      if ((kVar27._0_8_ & 0xffffffdf00000000) != 0x5300000000) {
        if (kVar27._0_8_ >> 0x20 == 0xe000) {
          clear_from(L'\x17');
          goto LAB_001d419d;
        }
        if (kVar27.code != 0x18) {
          cmdq_push(CMD_ACCEPT_CHARACTER);
          clear_from(L'\x17');
LAB_001d46f3:
          cmdq_execute(CTX_BIRTH);
          return L'\0';
        }
        quit((char *)0x0);
      }
      clear_from(L'\x17');
      uVar22 = 0;
    }
switchD_001d3409_default:
    cmdq_execute(CTX_BIRTH);
  } while( true );
}

Assistant:

int textui_do_birth(void)
{
	enum birth_stage current_stage = BIRTH_RESET;
	enum birth_stage prev = BIRTH_BACK;
	enum birth_stage roller = BIRTH_RESET;
	enum birth_stage next = current_stage;

	bool done = false;

	cmdq_push(CMD_BIRTH_INIT);
	cmdq_execute(CTX_BIRTH);

	while (!done) {

		switch (current_stage)
		{
			case BIRTH_RESET:
			{
				cmdq_push(CMD_BIRTH_RESET);

				roller = BIRTH_RESET;
				
				if (quickstart_allowed)
					next = BIRTH_QUICKSTART;
				else
					next = BIRTH_MAP_CHOICE;

				break;
			}

			case BIRTH_QUICKSTART:
			{
				display_player(0);
				next = textui_birth_quickstart();
				if (next == BIRTH_COMPLETE)
					done = true;
				break;
			}

			case BIRTH_MAP_CHOICE:
			{
				print_map_instructions();
				next = get_map_command();
				if (next == BIRTH_BACK)
					next = BIRTH_RESET;
				break;
			}

			case BIRTH_CLASS_CHOICE:
			case BIRTH_RACE_CHOICE:
			case BIRTH_ROLLER_CHOICE:
			{
				struct menu *menu = &race_menu;
				cmd_code command = CMD_CHOOSE_RACE;

				Term_clear();
				print_menu_instructions();

				if (current_stage > BIRTH_RACE_CHOICE) {
					menu_refresh(&race_menu, false);
					menu = &class_menu;
					command = CMD_CHOOSE_CLASS;
				}

				if (current_stage > BIRTH_CLASS_CHOICE) {
					menu_refresh(&class_menu, false);
					menu = &roller_menu;
				}

				next = menu_question(current_stage, menu, command);

				if (next == BIRTH_BACK)
					next = current_stage - 1;

				/* Make sure the character gets reset before quickstarting */
				if (next == BIRTH_QUICKSTART) 
					next = BIRTH_RESET;

				break;
			}

			case BIRTH_POINTBASED:
			{
				roller = BIRTH_POINTBASED;
		
				if (prev > BIRTH_POINTBASED) {
					point_based_start();
					/*
					 * Force a redraw of the point
					 * allocations but do not reset them.
					 */
					cmdq_push(CMD_REFRESH_STATS);
					cmdq_execute(CTX_BIRTH);
				}

				next = point_based_command();

				if (next == BIRTH_BACK)
					next = BIRTH_ROLLER_CHOICE;

				if (next != BIRTH_POINTBASED)
					point_based_stop();

				break;
			}

			case BIRTH_ROLLER:
			{
				roller = BIRTH_ROLLER;
				next = roller_command(prev < BIRTH_ROLLER);
				if (next == BIRTH_BACK)
					next = BIRTH_ROLLER_CHOICE;

				break;
			}

			case BIRTH_NAME_CHOICE:
			{
				if (prev < BIRTH_NAME_CHOICE)
					display_player(0);

				next = get_name_command();
				if (next == BIRTH_BACK)
					next = roller;

				break;
			}

			case BIRTH_HISTORY_CHOICE:
			{
				if (prev < BIRTH_HISTORY_CHOICE)
					display_player(0);

				next = get_history_command();
				if (next == BIRTH_BACK)
					next = BIRTH_NAME_CHOICE;

				break;
			}

			case BIRTH_FINAL_CONFIRM:
			{
				if (prev < BIRTH_FINAL_CONFIRM)
					display_player(0);

				next = get_confirm_command();
				if (next == BIRTH_BACK)
					next = BIRTH_HISTORY_CHOICE;

				if (next == BIRTH_COMPLETE)
					done = true;

				break;
			}

			default:
			{
				/* Remove dodgy compiler warning, */
			}
		}

		prev = current_stage;
		current_stage = next;

		/* Execute whatever commands have been sent */
		cmdq_execute(CTX_BIRTH);
	}

	return 0;
}